

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O1

ZCC_OpProto * __thiscall
ZCCCompiler::PromoteUnary(ZCCCompiler *this,EZCCExprType op,ZCC_Expression **expr)

{
  ZCC_ExprConstant *pZVar1;
  ZCC_OpProto *pZVar2;
  long lVar3;
  long lVar4;
  int routelen;
  Conversion *route [8];
  int local_7c;
  Conversion *local_78 [9];
  
  if ((*expr)->Type == &TypeError->super_PType) {
    pZVar2 = (ZCC_OpProto *)0x0;
  }
  else {
    local_7c = 8;
    pZVar2 = ZCC_OpInfoType::FindBestProto(ZCC_OpInfo + op,(*expr)->Type,local_78,&local_7c);
    if (pZVar2 != (ZCC_OpProto *)0x0) {
      pZVar1 = (ZCC_ExprConstant *)*expr;
      lVar4 = (long)local_7c;
      if (0 < lVar4) {
        lVar3 = 0;
        do {
          if ((pZVar1->super_ZCC_Expression).Operation == PEX_ConstValue) {
            (*local_78[lVar3]->ConvertConstant)(pZVar1,&this->AST->Strings);
          }
          lVar3 = lVar3 + 1;
        } while (lVar4 != lVar3);
      }
      *expr = (ZCC_Expression *)pZVar1;
    }
  }
  return pZVar2;
}

Assistant:

ZCC_OpProto *ZCCCompiler::PromoteUnary(EZCCExprType op, ZCC_Expression *&expr)
{
	if (expr->Type == TypeError)
	{
		return NULL;
	}
	const PType::Conversion *route[CONVERSION_ROUTE_SIZE];
	int routelen = countof(route);
	ZCC_OpProto *proto = ZCC_OpInfo[op].FindBestProto(expr->Type, route, routelen);

	if (proto != NULL)
	{
		expr = ApplyConversion(expr, route, routelen);
	}
	return proto;
}